

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

size_t __thiscall
OpenSSLWrapper::SslConnection::SslWrite
          (SslConnection *this,uint8_t *szBuffer,size_t nWriteLen,int *iErrorHint)

{
  bool bVar1;
  runtime_error *this_00;
  int *piVar2;
  char *pOut;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  SslConnection *pSStack_48;
  int iResult;
  size_t nWritten;
  int *local_30;
  int *iErrorHint_local;
  size_t nWriteLen_local;
  uint8_t *szBuffer_local;
  SslConnection *this_local;
  
  local_30 = iErrorHint;
  iErrorHint_local = (int *)nWriteLen;
  nWriteLen_local = (size_t)szBuffer;
  szBuffer_local = (uint8_t *)this;
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::mutex::lock(&this->m_mxSsl);
  ERR_clear_error();
  pSStack_48 = (SslConnection *)0x0;
  local_4c = SSL_write_ex(this->m_ssl,nWriteLen_local,iErrorHint_local,&stack0xffffffffffffffb8);
  if (local_4c < 1) {
    local_4c = SSL_get_error((SSL *)this->m_ssl,local_4c);
    if (local_30 != (int *)0x0) {
      *local_30 = local_4c;
    }
    std::mutex::unlock(&this->m_mxSsl);
    switch(local_4c) {
    case 2:
      this->m_iWantState = this->m_iWantState | 1;
      break;
    case 3:
      this->m_iWantState = this->m_iWantState | 2;
      break;
    case 5:
      piVar2 = __errno_location();
      local_4c = *piVar2;
    default:
      GetSslErrAsString_abi_cxx11_(&local_d0,this);
      std::operator+(&local_b0,&local_d0,"errno = ");
      std::__cxx11::to_string(&local_f0,local_4c);
      std::operator+(&local_90,&local_b0,&local_f0);
      std::operator+(&local_70,&local_90,"\r\n");
      pOut = (char *)std::__cxx11::string::c_str();
      OutputDebugStringA(pOut);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      this->m_iShutDownFlag = 1;
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fError);
      if (bVar1) {
        std::function<void_()>::operator()(&this->m_fError);
      }
      break;
    case 6:
      this->m_bZeroReceived = true;
      ShutDownConnection(this,local_30);
    }
    this_local = (SslConnection *)0x0;
  }
  else {
    std::mutex::unlock(&this->m_mxSsl);
    this_local = pSStack_48;
  }
  return (size_t)this_local;
}

Assistant:

size_t SslConnection::SslWrite(const uint8_t* szBuffer, size_t nWriteLen, int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        //OSSL_HANDSHAKE_STATE hsState = SSL_get_state(m_ssl);
        //if (hsState != TLS_ST_OK)
        //    OutputDebugString(wstring(L"SSL invalid state: " + to_wstring(hsState) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl)) + L"\r\n").c_str());

        m_mxSsl.lock();

        ERR_clear_error();
        size_t nWritten = 0;
        int iResult = SSL_write_ex(m_ssl, szBuffer, nWriteLen, &nWritten);
        if (iResult <= 0)
        {
            iResult = SSL_get_error(m_ssl, iResult);
            if (iErrorHint != nullptr)
                *iErrorHint = iResult;
            m_mxSsl.unlock();

            switch (iResult)
            {
            case SSL_ERROR_WANT_READ:
                m_iWantState |= 1; break;
            case SSL_ERROR_WANT_WRITE:
                m_iWantState |= 2; break;
            case SSL_ERROR_ZERO_RETURN:
                m_bZeroReceived = true;
                ShutDownConnection(iErrorHint);
                break;
            case SSL_ERROR_SYSCALL:
                iResult = errno;
                [[fallthrough]];
            default:
OutputDebugStringA(string(GetSslErrAsString() + "errno = " + to_string(iResult) + "\r\n").c_str());
                m_iShutDownFlag = 1;
                if (m_fError)
                    m_fError();
            }

            return 0;
        }
        m_mxSsl.unlock();

        return nWritten;
    }